

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluDrawUtil.cpp
# Opt level: O0

void glu::drawFromBuffers
               (RenderContext *context,deUint32 program,int numVertexArrays,
               VertexArrayBinding *vertexArrays,PrimitiveList *primitives,DrawUtilCallback *callback
               )

{
  insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
  out;
  pointer pVVar1;
  bool bVar2;
  int iVar3;
  deBool dVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  iterator iVar6;
  iterator end;
  TestError *this;
  size_type sVar7;
  VertexBufferDescriptor *buffer;
  pointer pVVar8;
  insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
  iVar9;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
  *in_stack_fffffffffffffe58;
  _Iter in_stack_fffffffffffffe60;
  code *pcVar10;
  VertexArrayBinding *local_178;
  __normal_iterator<glu::VertexArrayBinding_*,_std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
  local_100;
  __normal_iterator<glu::VertexArrayBinding_*,_std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
  local_f8;
  __normal_iterator<const_glu::VertexArrayBinding_*,_std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
  local_f0;
  const_iterator vaIter;
  IndexBuffer indexBuffer;
  VertexBuffer vertexBuffer;
  undefined1 local_50 [8];
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> bindingsWithLocations;
  Functions *gl;
  DrawUtilCallback *callback_local;
  PrimitiveList *primitives_local;
  VertexArrayBinding *vertexArrays_local;
  int numVertexArrays_local;
  deUint32 program_local;
  RenderContext *context_local;
  
  iVar3 = (*context->_vptr_RenderContext[3])();
  bindingsWithLocations.
  super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar3);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::vector
            ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)local_50);
  pVVar1 = bindingsWithLocations.
           super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  iVar6 = std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::begin
                    ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
                     local_50);
  iVar9 = std::
          inserter<std::vector<glu::VertexArrayBinding,std::allocator<glu::VertexArrayBinding>>>
                    ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
                     local_50,iVar6);
  out.iter._M_current = in_stack_fffffffffffffe60._M_current;
  out.container = in_stack_fffffffffffffe58;
  (anonymous_namespace)::
  namedBindingsToProgramLocations<glu::VertexArrayBinding_const*,std::insert_iterator<std::vector<glu::VertexArrayBinding,std::allocator<glu::VertexArrayBinding>>>>
            ((_anonymous_namespace_ *)pVVar1,(Functions *)(ulong)program,(deUint32)vertexArrays,
             vertexArrays + numVertexArrays,(VertexArrayBinding *)iVar9.container,out);
  while (dVar4 = ::deGetFalse(), dVar4 == 0) {
    iVar6 = std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::begin
                      ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
                       local_50);
    end = std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::end
                    ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
                     local_50);
    bVar2 = (anonymous_namespace)::
            areVertexArrayLocationsValid<__gnu_cxx::__normal_iterator<glu::VertexArrayBinding*,std::vector<glu::VertexArrayBinding,std::allocator<glu::VertexArrayBinding>>>>
                      ((__normal_iterator<glu::VertexArrayBinding_*,_std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
                        )iVar6._M_current,
                       (__normal_iterator<glu::VertexArrayBinding_*,_std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
                        )end._M_current);
    if (!bVar2) break;
    dVar4 = ::deGetFalse();
    if (dVar4 == 0) {
      sVar7 = std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::size
                        ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                          *)local_50);
      bVar2 = std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::empty
                        ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                          *)local_50);
      if (bVar2) {
        local_178 = (VertexArrayBinding *)0x0;
      }
      else {
        local_178 = std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
                    operator[]((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                *)local_50,0);
      }
      anon_unknown_4::VertexBuffer::VertexBuffer
                ((VertexBuffer *)&indexBuffer.super_Buffer.super_ObjectWrapper.m_object,context,
                 (int)sVar7,local_178,TYPE_PLANAR);
      pVVar1 = bindingsWithLocations.
               super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      buffer = anon_unknown_4::VertexBuffer::getDescriptor
                         ((VertexBuffer *)&indexBuffer.super_Buffer.super_ObjectWrapper.m_object);
      anon_unknown_4::setVertexBufferAttributes((Functions *)pVVar1,buffer);
      if (primitives->indices == (void *)0x0) {
        if (callback != (DrawUtilCallback *)0x0) {
          (**callback->_vptr_DrawUtilCallback)();
        }
        anon_unknown_4::drawNonIndexed
                  ((Functions *)
                   bindingsWithLocations.
                   super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,primitives->type,
                   primitives->numElements);
        if (callback != (DrawUtilCallback *)0x0) {
          (*callback->_vptr_DrawUtilCallback[1])();
        }
      }
      else {
        anon_unknown_4::IndexBuffer::IndexBuffer
                  ((IndexBuffer *)&vaIter,context,primitives->indexType,primitives->numElements,
                   primitives->indices);
        pcVar10 = *(code **)&((bindingsWithLocations.
                               super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->pointer).stride;
        dVar5 = ObjectWrapper::operator*((ObjectWrapper *)&vaIter);
        (*pcVar10)(0x8893,dVar5);
        if (callback != (DrawUtilCallback *)0x0) {
          (**callback->_vptr_DrawUtilCallback)();
        }
        anon_unknown_4::drawIndexed
                  ((Functions *)
                   bindingsWithLocations.
                   super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,primitives->type,
                   primitives->numElements,primitives->indexType,(void *)0x0);
        if (callback != (DrawUtilCallback *)0x0) {
          (*callback->_vptr_DrawUtilCallback[1])();
        }
        (**(code **)&((bindingsWithLocations.
                       super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->pointer).stride)
                  (0x8893,0);
        anon_unknown_4::IndexBuffer::~IndexBuffer((IndexBuffer *)&vaIter);
      }
      anon_unknown_4::VertexBuffer::~VertexBuffer
                ((VertexBuffer *)&indexBuffer.super_Buffer.super_ObjectWrapper.m_object);
      local_f8._M_current =
           (VertexArrayBinding *)
           std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::begin
                     ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
                      local_50);
      __gnu_cxx::
      __normal_iterator<glu::VertexArrayBinding_const*,std::vector<glu::VertexArrayBinding,std::allocator<glu::VertexArrayBinding>>>
      ::__normal_iterator<glu::VertexArrayBinding*>
                ((__normal_iterator<glu::VertexArrayBinding_const*,std::vector<glu::VertexArrayBinding,std::allocator<glu::VertexArrayBinding>>>
                  *)&local_f0,&local_f8);
      while( true ) {
        local_100._M_current =
             (VertexArrayBinding *)
             std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::end
                       ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *
                        )local_50);
        bVar2 = __gnu_cxx::operator!=(&local_f0,&local_100);
        if (!bVar2) break;
        pcVar10 = (code *)bindingsWithLocations.
                          super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage[0x10].binding.name.
                          field_2._M_allocated_capacity;
        pVVar8 = __gnu_cxx::
                 __normal_iterator<const_glu::VertexArrayBinding_*,_std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
                 ::operator->(&local_f0);
        (*pcVar10)((pVVar8->binding).location);
        __gnu_cxx::
        __normal_iterator<const_glu::VertexArrayBinding_*,_std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
        ::operator++(&local_f0);
      }
      std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
                ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
                 local_50);
      return;
    }
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,
             "areVertexArrayLocationsValid(bindingsWithLocations.begin(), bindingsWithLocations.end())"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluDrawUtil.cpp"
             ,0x21a);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void drawFromBuffers (const RenderContext& context, deUint32 program, int numVertexArrays, const VertexArrayBinding* vertexArrays, const PrimitiveList& primitives, DrawUtilCallback* callback)
{
	const glw::Functions&				gl		= context.getFunctions();
	std::vector<VertexArrayBinding>		bindingsWithLocations;

	DE_ASSERT(isDrawCallValid(numVertexArrays, vertexArrays, primitives));
	DE_ASSERT(isProgramActive(context, program));

	// Lower bindings to locations.
	namedBindingsToProgramLocations(gl, program, vertexArrays, vertexArrays+numVertexArrays, std::inserter(bindingsWithLocations, bindingsWithLocations.begin()));

	TCU_CHECK(areVertexArrayLocationsValid(bindingsWithLocations.begin(), bindingsWithLocations.end()));

	// Create buffers for duration of draw call.
	{
		VertexBuffer vertexBuffer (context, (int)bindingsWithLocations.size(), (bindingsWithLocations.empty()) ? (DE_NULL) : (&bindingsWithLocations[0]));

		// Set state.
		setVertexBufferAttributes(gl, vertexBuffer.getDescriptor());

		if (primitives.indices)
		{
			IndexBuffer indexBuffer(context, primitives.indexType, primitives.numElements, primitives.indices);

			gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, *indexBuffer);

			if (callback)
				callback->beforeDrawCall();

			drawIndexed(gl, primitives.type, primitives.numElements, primitives.indexType, 0);

			if (callback)
				callback->afterDrawCall();

			gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
		}
		else
		{
			if (callback)
				callback->beforeDrawCall();

			drawNonIndexed(gl, primitives.type, primitives.numElements);

			if (callback)
				callback->afterDrawCall();
		}
	}

	// Disable attribute arrays or otherwise someone later on might get crash thanks to invalid pointers.
	for (std::vector<VertexArrayBinding>::const_iterator vaIter = bindingsWithLocations.begin(); vaIter != bindingsWithLocations.end(); ++vaIter)
		gl.disableVertexAttribArray(vaIter->binding.location);
}